

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

int imagetotga(opj_image_t *image,char *outfile)

{
  OPJ_UINT32 *pOVar1;
  byte bVar2;
  opj_image_comp_t *poVar3;
  FILE *__s;
  size_t sVar4;
  long lVar5;
  int iVar6;
  OPJ_UINT32 OVar7;
  OPJ_UINT32 OVar8;
  uint uVar9;
  OPJ_UINT32 OVar10;
  ulong uVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  uchar value;
  uchar uc0;
  OPJ_UINT16 us0;
  char local_81;
  float local_80;
  int local_7c;
  int local_78;
  OPJ_UINT16 image_h;
  undefined1 local_72;
  uchar image_type;
  char *local_70;
  ulong local_68;
  OPJ_UINT32 local_60;
  OPJ_UINT32 local_5c;
  OPJ_UINT32 local_58;
  OPJ_UINT32 local_54;
  int local_50;
  float local_4c;
  float local_48;
  OPJ_UINT16 image_w;
  opj_image_t *local_40;
  long local_38;
  
  __s = fopen(outfile,"wb");
  if (__s == (FILE *)0x0) {
    fprintf(_stderr,"ERROR -> failed to open %s for writing\n",outfile);
    return 1;
  }
  uVar9 = image->numcomps;
  local_68 = (ulong)uVar9;
  poVar3 = image->comps;
  lVar5 = 0;
  while ((ulong)(uVar9 - 1) * 0x40 + 0x40 != lVar5 + 0x40) {
    if ((((poVar3->dx != *(OPJ_UINT32 *)((long)&poVar3[1].dx + lVar5)) ||
         (poVar3->dy != *(OPJ_UINT32 *)((long)&poVar3[1].dy + lVar5))) ||
        (poVar3->prec != *(OPJ_UINT32 *)((long)&poVar3[1].prec + lVar5))) ||
       (pOVar1 = (OPJ_UINT32 *)((long)&poVar3[1].sgnd + lVar5), lVar5 = lVar5 + 0x40,
       poVar3->sgnd != *pOVar1)) {
      fclose(__s);
      fwrite("Unable to create a tga file with such J2K image charateristics.\n",0x40,1,_stderr);
      return 1;
    }
  }
  OVar7 = poVar3->w;
  OVar8 = poVar3->h;
  if (OVar8 != 0 && OVar7 != 0) {
    local_81 = ((uVar9 - 2 & 0xfffffffd) == 0) * '\b' + '\x18';
    uc0 = '\0';
    sVar4 = fwrite(&uc0,1,1,__s);
    if ((sVar4 == 1) && (sVar4 = fwrite(&uc0,1,1,__s), sVar4 == 1)) {
      image_type = '\x02';
      sVar4 = fwrite(&image_type,1,1,__s);
      if (sVar4 == 1) {
        us0 = 0;
        sVar4 = fwrite(&us0,2,1,__s);
        if (((sVar4 == 1) && (sVar4 = fwrite(&us0,2,1,__s), sVar4 == 1)) &&
           ((sVar4 = fwrite(&uc0,1,1,__s), sVar4 == 1 &&
            ((sVar4 = fwrite(&us0,2,1,__s), sVar4 == 1 && (sVar4 = fwrite(&us0,2,1,__s), sVar4 == 1)
             ))))) {
          image_w = (OPJ_UINT16)OVar7;
          image_h = (OPJ_UINT16)OVar8;
          sVar4 = fwrite(&image_w,2,1,__s);
          if ((sVar4 == 1) &&
             ((sVar4 = fwrite(&image_h,2,1,__s), sVar4 == 1 &&
              (sVar4 = fwrite(&local_81,1,1,__s), sVar4 == 1)))) {
            local_72 = 0x28;
            sVar4 = fwrite(&local_72,1,1,__s);
            if (sVar4 == 1) {
              poVar3 = image->comps;
              bVar2 = (byte)poVar3->prec;
              local_50 = 1 << (bVar2 - 1 & 0x1f);
              if (poVar3->sgnd == 0) {
                local_50 = 0;
              }
              local_7c = 0;
              local_78 = 0;
              if (2 < image->numcomps) {
                local_78 = 0;
                local_7c = 0;
                if (poVar3[1].sgnd != 0) {
                  local_7c = 1 << ((char)poVar3[1].prec - 1U & 0x1f);
                }
                if (poVar3[2].sgnd != 0) {
                  local_78 = 1 << ((char)poVar3[2].prec - 1U & 0x1f);
                }
              }
              local_80 = 255.0 / (float)~(-1 << (bVar2 & 0x1f));
              local_5c = 0;
              if (0 < (int)OVar7) {
                local_5c = OVar7;
              }
              OVar10 = 0;
              if ((int)OVar8 < 1) {
                OVar8 = 0;
              }
              local_38 = (ulong)(image->numcomps - 1) << 6;
              local_70 = outfile;
              local_60 = OVar7;
              local_58 = OVar8;
              local_40 = image;
              while (OVar10 != local_58) {
                uVar9 = OVar10 * local_60;
                OVar7 = local_5c;
                local_54 = OVar10;
                while (bVar12 = OVar7 != 0, OVar7 = OVar7 - 1, bVar12) {
                  poVar3 = local_40->comps;
                  uVar11 = (ulong)uVar9;
                  iVar6 = poVar3->data[uVar11] + local_50;
                  local_4c = (float)iVar6;
                  fVar13 = local_4c;
                  local_48 = local_4c;
                  if (2 < local_40->numcomps) {
                    local_48 = (float)(poVar3[1].data[uVar11] + local_7c);
                    fVar13 = (float)(poVar3[2].data[uVar11] + local_78);
                  }
                  fVar14 = 255.0;
                  if ((fVar13 <= 255.0) && (fVar14 = fVar13, fVar13 < 0.0)) {
                    fVar14 = 0.0;
                  }
                  value = (uchar)(int)(fVar14 * local_80);
                  sVar4 = fwrite(&value,1,1,__s);
                  if (sVar4 == 0) {
LAB_00107c8a:
                    fprintf(_stderr,"failed to write 1 byte for %s\n",local_70);
                    goto LAB_00107cc9;
                  }
                  fVar13 = 255.0;
                  if ((local_48 <= 255.0) && (fVar13 = local_48, local_48 < 0.0)) {
                    fVar13 = 0.0;
                  }
                  value = (uchar)(int)(fVar13 * local_80);
                  sVar4 = fwrite(&value,1,1,__s);
                  if (sVar4 == 0) goto LAB_00107c8a;
                  fVar13 = 255.0;
                  if ((iVar6 < 0x100) && (fVar13 = local_4c, iVar6 < 0)) {
                    fVar13 = 0.0;
                  }
                  value = (uchar)(int)(fVar13 * local_80);
                  sVar4 = fwrite(&value,1,1,__s);
                  if (sVar4 == 0) {
LAB_00107cac:
                    fprintf(_stderr,"failed to write 1 byte for %s\n",local_70);
                    goto LAB_00107cc9;
                  }
                  if (((int)local_68 == 4) || ((int)local_68 == 2)) {
                    iVar6 = *(int *)(*(long *)((long)&local_40->comps->data + local_38) + uVar11 * 4
                                    );
                    fVar13 = 255.0;
                    if (iVar6 < 0x100) {
                      if (iVar6 < 0) {
                        fVar13 = 0.0;
                      }
                      else {
                        fVar13 = (float)iVar6;
                      }
                    }
                    value = (uchar)(int)(fVar13 * local_80);
                    sVar4 = fwrite(&value,1,1,__s);
                    if (sVar4 == 0) goto LAB_00107cac;
                  }
                  uVar9 = uVar9 + 1;
                }
                OVar10 = local_54 + 1;
              }
              iVar6 = 0;
              goto LAB_00107ccc;
            }
          }
        }
      }
    }
    fputs("\nwrite_tgaheader: write ERROR\n",_stderr);
  }
LAB_00107cc9:
  iVar6 = 1;
LAB_00107ccc:
  fclose(__s);
  return iVar6;
}

Assistant:

int imagetotga(opj_image_t * image, const char *outfile)
{
    int width, height, bpp, x, y;
    OPJ_BOOL write_alpha;
    unsigned int i;
    int adjustR, adjustG = 0, adjustB = 0, fails;
    unsigned int alpha_channel;
    float r, g, b, a;
    unsigned char value;
    float scale;
    FILE *fdest;
    size_t res;
    fails = 1;

    fdest = fopen(outfile, "wb");
    if (!fdest) {
        fprintf(stderr, "ERROR -> failed to open %s for writing\n", outfile);
        return 1;
    }

    for (i = 0; i < image->numcomps - 1; i++) {
        if ((image->comps[0].dx != image->comps[i + 1].dx)
                || (image->comps[0].dy != image->comps[i + 1].dy)
                || (image->comps[0].prec != image->comps[i + 1].prec)
                || (image->comps[0].sgnd != image->comps[i + 1].sgnd)) {
            fclose(fdest);
            fprintf(stderr,
                    "Unable to create a tga file with such J2K image charateristics.\n");
            return 1;
        }
    }

    width  = (int)image->comps[0].w;
    height = (int)image->comps[0].h;

    /* Mono with alpha, or RGB with alpha. */
    write_alpha = (image->numcomps == 2) || (image->numcomps == 4);

    /* Write TGA header  */
    bpp = write_alpha ? 32 : 24;

    if (!tga_writeheader(fdest, bpp, width, height, OPJ_TRUE)) {
        goto fin;
    }

    alpha_channel = image->numcomps - 1;

    scale = 255.0f / (float)((1 << image->comps[0].prec) - 1);

    adjustR = (image->comps[0].sgnd ? 1 << (image->comps[0].prec - 1) : 0);
    if (image->numcomps >= 3) {
        adjustG = (image->comps[1].sgnd ? 1 << (image->comps[1].prec - 1) : 0);
        adjustB = (image->comps[2].sgnd ? 1 << (image->comps[2].prec - 1) : 0);
    }

    for (y = 0; y < height; y++) {
        unsigned int index = (unsigned int)(y * width);

        for (x = 0; x < width; x++, index++) {
            r = (float)(image->comps[0].data[index] + adjustR);

            if (image->numcomps > 2) {
                g = (float)(image->comps[1].data[index] + adjustG);
                b = (float)(image->comps[2].data[index] + adjustB);
            } else {
                /* Greyscale ... */
                g = r;
                b = r;
            }

            /* TGA format writes BGR ... */
            if (b > 255.) {
                b = 255.;
            } else if (b < 0.) {
                b = 0.;
            }
            value = (unsigned char)(b * scale);
            res = fwrite(&value, 1, 1, fdest);

            if (res < 1) {
                fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                goto fin;
            }
            if (g > 255.) {
                g = 255.;
            } else if (g < 0.) {
                g = 0.;
            }
            value = (unsigned char)(g * scale);
            res = fwrite(&value, 1, 1, fdest);

            if (res < 1) {
                fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                goto fin;
            }
            if (r > 255.) {
                r = 255.;
            } else if (r < 0.) {
                r = 0.;
            }
            value = (unsigned char)(r * scale);
            res = fwrite(&value, 1, 1, fdest);

            if (res < 1) {
                fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                goto fin;
            }

            if (write_alpha) {
                a = (float)(image->comps[alpha_channel].data[index]);
                if (a > 255.) {
                    a = 255.;
                } else if (a < 0.) {
                    a = 0.;
                }
                value = (unsigned char)(a * scale);
                res = fwrite(&value, 1, 1, fdest);

                if (res < 1) {
                    fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                    goto fin;
                }
            }
        }
    }
    fails = 0;
fin:
    fclose(fdest);

    return fails;
}